

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall testing::Matcher<double>::Matcher(Matcher<double> *this,double value)

{
  MatcherBase<double> local_30;
  double local_18;
  
  (this->super_MatcherBase<double>).impl_.value_ = (MatcherInterface<double> *)0x0;
  (this->super_MatcherBase<double>).impl_.link_.next_ =
       &(this->super_MatcherBase<double>).impl_.link_;
  (this->super_MatcherBase<double>)._vptr_MatcherBase = (_func_int **)&PTR__MatcherBase_001b9458;
  local_18 = value;
  internal::EqMatcher::operator_cast_to_Matcher((Matcher<double> *)&local_30,(EqMatcher *)&local_18)
  ;
  internal::linked_ptr<const_testing::MatcherInterface<double>_>::operator=
            (&(this->super_MatcherBase<double>).impl_,&local_30.impl_);
  internal::MatcherBase<double>::~MatcherBase(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) { *this = Eq(value); }